

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_16::NameResolver::NameResolver(NameResolver *this,Script *script,Errors *errors)

{
  Errors *errors_local;
  Script *script_local;
  NameResolver *this_local;
  
  ExprVisitor::DelegateNop::DelegateNop(&this->super_DelegateNop);
  (this->super_DelegateNop).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR__NameResolver_004b3b50;
  this->errors_ = errors;
  this->script_ = script;
  this->current_module_ = (Module *)0x0;
  this->current_func_ = (Func *)0x0;
  ExprVisitor::ExprVisitor(&this->visitor_,(Delegate *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->labels_);
  Result::Result(&this->result_,Ok);
  return;
}

Assistant:

NameResolver::NameResolver(Script* script, Errors* errors)
    : errors_(errors),
      script_(script),
      visitor_(this) {}